

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeezenet_c_api.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ncnn_net_t net;
  ncnn_option_t opt;
  ncnn_mat_t mat;
  ncnn_extractor_t ex;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  int i;
  long lVar8;
  ncnn_mat_t local_e0;
  vector<float,_std::allocator<float>_> cls_scores;
  float mean_vals [3];
  undefined4 uStack_ac;
  Mat m;
  int local_88;
  int local_84;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    std::__cxx11::string::string((string *)mean_vals,pcVar1,(allocator *)&cls_scores);
    cv::imread((string *)&m,(int)mean_vals);
    std::__cxx11::string::~string((string *)mean_vals);
    cVar2 = cv::Mat::empty();
    if (cVar2 == '\0') {
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      net = ncnn_net_create();
      opt = ncnn_option_create();
      ncnn_option_set_use_vulkan_compute(opt,1);
      ncnn_net_set_option(net,opt);
      iVar3 = ncnn_net_load_param(net,"squeezenet_v1.1.param");
      if ((iVar3 != 0) || (iVar3 = ncnn_net_load_model(net,"squeezenet_v1.1.bin"), iVar3 != 0)) {
        exit(-1);
      }
      mat = ncnn_mat_from_pixels_resize
                      (local_80,2,local_84,local_88,local_84 * 3,0xe3,0xe3,(ncnn_allocator_t)0x0);
      mean_vals[0] = 104.0;
      mean_vals[1] = 117.0;
      stack0xffffffffffffff50 = (pointer)CONCAT44(uStack_ac,0x42f60000);
      ncnn_mat_substract_mean_normalize(mat,mean_vals,(float *)0x0);
      ex = ncnn_extractor_create(net);
      ncnn_extractor_input(ex,"data",mat);
      ncnn_extractor_extract(ex,"prob",&local_e0);
      uVar4 = ncnn_mat_get_w(local_e0);
      pvVar5 = ncnn_mat_get_data(local_e0);
      std::vector<float,_std::allocator<float>_>::resize(&cls_scores,(long)(int)uVar4);
      uVar6 = 0;
      uVar7 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar7 = uVar6;
      }
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar6] = *(float *)((long)pvVar5 + uVar6 * 4);
      }
      ncnn_mat_destroy(mat);
      ncnn_mat_destroy(local_e0);
      ncnn_extractor_destroy(ex);
      ncnn_option_destroy(opt);
      ncnn_net_destroy(net);
      mean_vals[0] = 0.0;
      mean_vals[1] = 0.0;
      stack0xffffffffffffff50 = (pointer)0x0;
      uVar7 = (ulong)((long)cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      iVar3 = (int)uVar7;
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::resize
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)mean_vals
                 ,(long)iVar3);
      uVar6 = 0;
      uVar7 = uVar7 & 0xffffffff;
      if (iVar3 < 1) {
        uVar7 = uVar6;
      }
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        *(float *)(mean_vals._0_8_ + uVar6 * 8) =
             cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6];
        *(int *)(mean_vals._0_8_ + 4 + uVar6 * 8) = (int)uVar6;
      }
      std::
      __partial_sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<float,int>>>>
                (mean_vals._0_8_,mean_vals._0_8_ + 0x18,stack0xffffffffffffff50);
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        fprintf(_stderr,"%d = %f\n",SUB84((double)*(float *)(mean_vals._0_8_ + lVar8 * 8),0),
                (ulong)*(uint *)(mean_vals._0_8_ + 4 + lVar8 * 8));
      }
      std::_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::
      ~_Vector_base((_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                    mean_vals);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&cls_scores.super__Vector_base<float,_std::allocator<float>_>);
      iVar3 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar1);
      iVar3 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<float> cls_scores;
    detect_squeezenet(m, cls_scores);

    print_topk(cls_scores, 3);

    return 0;
}